

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86_avx::forward_inplace
          (HardSigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  undefined1 (*pauVar7) [32];
  int _c;
  int iVar8;
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  Mat local_78;
  
  iVar9 = bottom_top_blob->c;
  iVar8 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar8 < 1) {
      iVar8 = _c;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    for (; _c != iVar9; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar7 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      auVar16._16_4_ = 0x3f800000;
      auVar16._20_4_ = 0x3f800000;
      auVar16._24_4_ = 0x3f800000;
      auVar16._28_4_ = 0x3f800000;
      pp_Var2 = this->_vptr_HardSigmoid_x86_avx;
      iVar6 = iVar8;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        fVar14 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar12._0_4_ = fVar14 * *(float *)*pauVar7 + fVar1;
        auVar12._4_4_ = fVar14 * *(float *)(*pauVar7 + 4) + fVar1;
        auVar12._8_4_ = fVar14 * *(float *)(*pauVar7 + 8) + fVar1;
        auVar12._12_4_ = fVar14 * *(float *)(*pauVar7 + 0xc) + fVar1;
        auVar12._16_4_ = fVar14 * *(float *)(*pauVar7 + 0x10) + fVar1;
        auVar12._20_4_ = fVar14 * *(float *)(*pauVar7 + 0x14) + fVar1;
        auVar12._24_4_ = fVar14 * *(float *)(*pauVar7 + 0x18) + fVar1;
        auVar12._28_4_ = fVar14 + fVar1;
        auVar12 = vmaxps_avx(auVar12,ZEXT1632(ZEXT816(0) << 0x40));
        auVar12 = vminps_avx(auVar12,auVar16);
        *pauVar7 = auVar12;
        pauVar7 = pauVar7 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar8 < 1) {
      iVar8 = _c;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    for (; _c != iVar9; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar7 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      pp_Var2 = this->_vptr_HardSigmoid_x86_avx;
      iVar6 = iVar8;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        fVar14 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar11._0_4_ = fVar14 * *(float *)*pauVar7 + fVar1;
        auVar11._4_4_ = fVar14 * *(float *)(*pauVar7 + 4) + fVar1;
        auVar11._8_4_ = fVar14 * *(float *)(*pauVar7 + 8) + fVar1;
        auVar11._12_4_ = fVar14 * *(float *)(*pauVar7 + 0xc) + fVar1;
        auVar11 = vmaxps_avx(auVar11,ZEXT816(0) << 0x40);
        auVar11 = vminps_avx(auVar11,auVar15);
        *(undefined1 (*) [16])*pauVar7 = auVar11;
        pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
      }
    }
  }
  else {
    if (iVar9 < 1) {
      iVar9 = _c;
    }
    for (; _c != iVar9; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar4 = local_78.data;
      Mat::~Mat(&local_78);
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      auVar17._16_4_ = 0x3f800000;
      auVar17._20_4_ = 0x3f800000;
      auVar17._24_4_ = 0x3f800000;
      auVar17._28_4_ = 0x3f800000;
      pp_Var2 = this->_vptr_HardSigmoid_x86_avx;
      lVar5 = 0;
      pauVar7 = (undefined1 (*) [32])pvVar4;
      for (iVar6 = 0; iVar6 + 7 < iVar8; iVar6 = iVar6 + 8) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        fVar14 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        auVar13._0_4_ = fVar14 * *(float *)*pauVar7 + fVar1;
        auVar13._4_4_ = fVar14 * *(float *)(*pauVar7 + 4) + fVar1;
        auVar13._8_4_ = fVar14 * *(float *)(*pauVar7 + 8) + fVar1;
        auVar13._12_4_ = fVar14 * *(float *)(*pauVar7 + 0xc) + fVar1;
        auVar13._16_4_ = fVar14 * *(float *)(*pauVar7 + 0x10) + fVar1;
        auVar13._20_4_ = fVar14 * *(float *)(*pauVar7 + 0x14) + fVar1;
        auVar13._24_4_ = fVar14 * *(float *)(*pauVar7 + 0x18) + fVar1;
        auVar13._28_4_ = fVar14 + fVar1;
        auVar16 = vmaxps_avx(auVar13,ZEXT1632(ZEXT816(0) << 0x40));
        auVar16 = vminps_avx(auVar16,auVar17);
        *pauVar7 = auVar16;
        pauVar7 = pauVar7 + 1;
        lVar5 = lVar5 + 8;
      }
      pp_Var2 = this->_vptr_HardSigmoid_x86_avx;
      for (; (int)lVar5 < iVar8; lVar5 = lVar5 + 1) {
        fVar1 = *(float *)((undefined1 *)pvVar4 + lVar5 * 4);
        p_Var3 = pp_Var2[-3];
        fVar14 = 0.0;
        if ((*(float *)(&this->field_0xd8 + (long)p_Var3) <= fVar1) &&
           (fVar14 = 1.0, fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var3))) {
          fVar14 = fVar1 * *(float *)(&this->field_0xd0 + (long)p_Var3) +
                   *(float *)(&this->field_0xd4 + (long)p_Var3);
        }
        *(float *)((undefined1 *)pvVar4 + lVar5 * 4) = fVar14;
      }
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ++ptr;
        }
    }

    return 0;
}